

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O0

void idtx32x8_sse4_1(__m128i *in,__m128i *out,int bit,int col_num)

{
  longlong lVar1;
  longlong lVar2;
  longlong lVar3;
  longlong lVar4;
  __m128i *palVar5;
  int local_124;
  int local_108;
  int iStack_104;
  int iStack_100;
  int iStack_fc;
  int local_f8;
  int iStack_f4;
  int iStack_f0;
  int iStack_ec;
  int local_e8;
  int iStack_e4;
  int iStack_e0;
  int iStack_dc;
  int local_d8;
  int iStack_d4;
  int iStack_d0;
  int iStack_cc;
  int local_c8;
  int iStack_c4;
  int iStack_c0;
  int iStack_bc;
  int local_b8;
  int iStack_b4;
  int iStack_b0;
  int iStack_ac;
  int local_a8;
  int iStack_a4;
  int iStack_a0;
  int iStack_9c;
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int iStack_88;
  int iStack_84;
  int iStack_80;
  int j;
  int col_num_local;
  int bit_local;
  __m128i *out_local;
  __m128i *in_local;
  int iStack_60;
  int iStack_5c;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  int local_38;
  int iStack_34;
  int iStack_30;
  int iStack_2c;
  int local_28;
  int iStack_24;
  int iStack_20;
  int iStack_1c;
  int local_18;
  int iStack_14;
  int iStack_10;
  int iStack_c;
  
  for (local_124 = 0; local_124 < 2; local_124 = local_124 + 1) {
    lVar1 = in[local_124][0];
    lVar2 = in[local_124][1];
    lVar3 = in[local_124][0];
    lVar4 = in[local_124][1];
    local_18 = (int)lVar1;
    iStack_14 = (int)((ulong)lVar1 >> 0x20);
    iStack_10 = (int)lVar2;
    iStack_c = (int)((ulong)lVar2 >> 0x20);
    local_28 = (int)lVar3;
    iStack_24 = (int)((ulong)lVar3 >> 0x20);
    iStack_20 = (int)lVar4;
    iStack_1c = (int)((ulong)lVar4 >> 0x20);
    palVar5 = out + local_124;
    *(int *)*palVar5 = local_18 + local_28;
    *(int *)((long)*palVar5 + 4) = iStack_14 + iStack_24;
    *(int *)(*palVar5 + 1) = iStack_10 + iStack_20;
    *(int *)((long)*palVar5 + 0xc) = iStack_c + iStack_1c;
    lVar1 = in[local_124 + 8][0];
    lVar2 = in[local_124 + 8][1];
    lVar3 = in[local_124 + 8][0];
    lVar4 = in[local_124 + 8][1];
    local_38 = (int)lVar1;
    iStack_34 = (int)((ulong)lVar1 >> 0x20);
    iStack_30 = (int)lVar2;
    iStack_2c = (int)((ulong)lVar2 >> 0x20);
    local_48 = (int)lVar3;
    iStack_44 = (int)((ulong)lVar3 >> 0x20);
    iStack_40 = (int)lVar4;
    iStack_3c = (int)((ulong)lVar4 >> 0x20);
    palVar5 = out + (local_124 + 8);
    *(int *)*palVar5 = local_38 + local_48;
    *(int *)((long)*palVar5 + 4) = iStack_34 + iStack_44;
    *(int *)(*palVar5 + 1) = iStack_30 + iStack_40;
    *(int *)((long)*palVar5 + 0xc) = iStack_2c + iStack_3c;
    lVar1 = in[local_124 + 0x10][0];
    lVar2 = in[local_124 + 0x10][1];
    lVar3 = in[local_124 + 0x10][0];
    lVar4 = in[local_124 + 0x10][1];
    local_58 = (int)lVar1;
    iStack_54 = (int)((ulong)lVar1 >> 0x20);
    iStack_50 = (int)lVar2;
    iStack_4c = (int)((ulong)lVar2 >> 0x20);
    in_local._0_4_ = (int)lVar3;
    in_local._4_4_ = (int)((ulong)lVar3 >> 0x20);
    iStack_60 = (int)lVar4;
    iStack_5c = (int)((ulong)lVar4 >> 0x20);
    palVar5 = out + (local_124 + 0x10);
    *(int *)*palVar5 = local_58 + (int)in_local;
    *(int *)((long)*palVar5 + 4) = iStack_54 + in_local._4_4_;
    *(int *)(*palVar5 + 1) = iStack_50 + iStack_60;
    *(int *)((long)*palVar5 + 0xc) = iStack_4c + iStack_5c;
    lVar1 = in[local_124 + 0x18][0];
    lVar2 = in[local_124 + 0x18][1];
    lVar3 = in[local_124 + 0x18][0];
    lVar4 = in[local_124 + 0x18][1];
    col_num_local = (int)lVar1;
    bit_local = (int)((ulong)lVar1 >> 0x20);
    out_local._0_4_ = (int)lVar2;
    out_local._4_4_ = (int)((ulong)lVar2 >> 0x20);
    iStack_88 = (int)lVar3;
    iStack_84 = (int)((ulong)lVar3 >> 0x20);
    iStack_80 = (int)lVar4;
    j = (int)((ulong)lVar4 >> 0x20);
    palVar5 = out + (local_124 + 0x18);
    *(int *)*palVar5 = col_num_local + iStack_88;
    *(int *)((long)*palVar5 + 4) = bit_local + iStack_84;
    *(int *)(*palVar5 + 1) = (int)out_local + iStack_80;
    *(int *)((long)*palVar5 + 0xc) = out_local._4_4_ + j;
    lVar1 = in[local_124 + 0x20][0];
    lVar2 = in[local_124 + 0x20][1];
    lVar3 = in[local_124 + 0x20][0];
    lVar4 = in[local_124 + 0x20][1];
    local_98 = (int)lVar1;
    iStack_94 = (int)((ulong)lVar1 >> 0x20);
    iStack_90 = (int)lVar2;
    iStack_8c = (int)((ulong)lVar2 >> 0x20);
    local_a8 = (int)lVar3;
    iStack_a4 = (int)((ulong)lVar3 >> 0x20);
    iStack_a0 = (int)lVar4;
    iStack_9c = (int)((ulong)lVar4 >> 0x20);
    palVar5 = out + (local_124 + 0x20);
    *(int *)*palVar5 = local_98 + local_a8;
    *(int *)((long)*palVar5 + 4) = iStack_94 + iStack_a4;
    *(int *)(*palVar5 + 1) = iStack_90 + iStack_a0;
    *(int *)((long)*palVar5 + 0xc) = iStack_8c + iStack_9c;
    lVar1 = in[local_124 + 0x28][0];
    lVar2 = in[local_124 + 0x28][1];
    lVar3 = in[local_124 + 0x28][0];
    lVar4 = in[local_124 + 0x28][1];
    local_b8 = (int)lVar1;
    iStack_b4 = (int)((ulong)lVar1 >> 0x20);
    iStack_b0 = (int)lVar2;
    iStack_ac = (int)((ulong)lVar2 >> 0x20);
    local_c8 = (int)lVar3;
    iStack_c4 = (int)((ulong)lVar3 >> 0x20);
    iStack_c0 = (int)lVar4;
    iStack_bc = (int)((ulong)lVar4 >> 0x20);
    palVar5 = out + (local_124 + 0x28);
    *(int *)*palVar5 = local_b8 + local_c8;
    *(int *)((long)*palVar5 + 4) = iStack_b4 + iStack_c4;
    *(int *)(*palVar5 + 1) = iStack_b0 + iStack_c0;
    *(int *)((long)*palVar5 + 0xc) = iStack_ac + iStack_bc;
    lVar1 = in[local_124 + 0x30][0];
    lVar2 = in[local_124 + 0x30][1];
    lVar3 = in[local_124 + 0x30][0];
    lVar4 = in[local_124 + 0x30][1];
    local_d8 = (int)lVar1;
    iStack_d4 = (int)((ulong)lVar1 >> 0x20);
    iStack_d0 = (int)lVar2;
    iStack_cc = (int)((ulong)lVar2 >> 0x20);
    local_e8 = (int)lVar3;
    iStack_e4 = (int)((ulong)lVar3 >> 0x20);
    iStack_e0 = (int)lVar4;
    iStack_dc = (int)((ulong)lVar4 >> 0x20);
    palVar5 = out + (local_124 + 0x30);
    *(int *)*palVar5 = local_d8 + local_e8;
    *(int *)((long)*palVar5 + 4) = iStack_d4 + iStack_e4;
    *(int *)(*palVar5 + 1) = iStack_d0 + iStack_e0;
    *(int *)((long)*palVar5 + 0xc) = iStack_cc + iStack_dc;
    lVar1 = in[local_124 + 0x38][0];
    lVar2 = in[local_124 + 0x38][1];
    lVar3 = in[local_124 + 0x38][0];
    lVar4 = in[local_124 + 0x38][1];
    local_f8 = (int)lVar1;
    iStack_f4 = (int)((ulong)lVar1 >> 0x20);
    iStack_f0 = (int)lVar2;
    iStack_ec = (int)((ulong)lVar2 >> 0x20);
    local_108 = (int)lVar3;
    iStack_104 = (int)((ulong)lVar3 >> 0x20);
    iStack_100 = (int)lVar4;
    iStack_fc = (int)((ulong)lVar4 >> 0x20);
    palVar5 = out + (local_124 + 0x38);
    *(int *)*palVar5 = local_f8 + local_108;
    *(int *)((long)*palVar5 + 4) = iStack_f4 + iStack_104;
    *(int *)(*palVar5 + 1) = iStack_f0 + iStack_100;
    *(int *)((long)*palVar5 + 0xc) = iStack_ec + iStack_fc;
  }
  return;
}

Assistant:

static void idtx32x8_sse4_1(__m128i *in, __m128i *out, int bit, int col_num) {
  (void)bit;
  (void)col_num;
  for (int j = 0; j < 2; j++) {
    out[j + 8 * 0] = _mm_add_epi32(in[j + 8 * 0], in[j + 8 * 0]);
    out[j + 8 * 1] = _mm_add_epi32(in[j + 8 * 1], in[j + 8 * 1]);
    out[j + 8 * 2] = _mm_add_epi32(in[j + 8 * 2], in[j + 8 * 2]);
    out[j + 8 * 3] = _mm_add_epi32(in[j + 8 * 3], in[j + 8 * 3]);
    out[j + 8 * 4] = _mm_add_epi32(in[j + 8 * 4], in[j + 8 * 4]);
    out[j + 8 * 5] = _mm_add_epi32(in[j + 8 * 5], in[j + 8 * 5]);
    out[j + 8 * 6] = _mm_add_epi32(in[j + 8 * 6], in[j + 8 * 6]);
    out[j + 8 * 7] = _mm_add_epi32(in[j + 8 * 7], in[j + 8 * 7]);
  }
}